

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::ParsedIR::get_member_decoration_string_abi_cxx11_
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  bool bVar1;
  Decoration *pDVar2;
  Decoration *dec;
  Meta *local_30;
  Meta *m;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  string *psStack_10;
  TypeID id_local;
  
  m._0_4_ = decoration;
  m._4_4_ = index;
  _decoration_local = this;
  this_local._4_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&dec + 4),
             (TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = find_meta(this,dec._4_4_);
  if (local_30 == (Meta *)0x0) {
    psStack_10 = &this->empty_string;
  }
  else {
    dec._0_4_ = this_local._4_4_;
    bVar1 = has_member_decoration(this,this_local._4_4_,m._4_4_,(Decoration)m);
    if (bVar1) {
      pDVar2 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                         (&(local_30->members).
                           super_VectorView<diligent_spirv_cross::Meta::Decoration>,(ulong)m._4_4_);
      if ((Decoration)m == DecorationHlslSemanticGOOGLE) {
        psStack_10 = &pDVar2->hlsl_semantic;
      }
      else {
        psStack_10 = &this->empty_string;
      }
    }
    else {
      psStack_10 = &this->empty_string;
    }
  }
  return psStack_10;
}

Assistant:

const string &ParsedIR::get_member_decoration_string(TypeID id, uint32_t index, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (!has_member_decoration(id, index, decoration))
			return empty_string;

		auto &dec = m->members[index];

		switch (decoration)
		{
		case DecorationHlslSemanticGOOGLE:
			return dec.hlsl_semantic;

		default:
			return empty_string;
		}
	}
	else
		return empty_string;
}